

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O1

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTSize *pCVar1;
  long *plVar2;
  ushort uVar3;
  CTSize CVar4;
  CType *pCVar5;
  CTInfo CVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  ulong uVar10;
  TValue *pTVar11;
  ulong uVar12;
  uint uVar13;
  cTValue *dp;
  uint32_t i;
  long lVar14;
  uint uVar15;
  cTValue *pcVar16;
  int iVar17;
  CTState *cts;
  CType *pCVar18;
  uint uVar19;
  CType *pCVar20;
  bool bVar21;
  bool bVar22;
  int rcl [2];
  CCallState cc;
  uint local_25c;
  uint local_238 [2];
  cTValue *local_230;
  cTValue local_228 [3];
  uint local_20c;
  cTValue *local_208;
  TValue *local_200;
  GCcdata local_1f8;
  uint local_1f0;
  byte local_1ec;
  char local_1eb;
  byte local_1ea;
  byte local_1e9;
  cTValue local_1e8 [16];
  cTValue local_168 [6];
  cTValue local_138 [33];
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pCVar18 = cts->tab;
  pCVar20 = pCVar18 + cd->ctypeid;
  if ((pCVar18[cd->ctypeid].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar20->size;
    pCVar20 = pCVar18 + (ushort)pCVar20->info;
    bVar21 = *pCVar1 == 4;
  }
  else {
    bVar21 = false;
  }
  if ((pCVar20->info & 0xf0000000) != 0x60000000) {
    return -1;
  }
  if (bVar21) {
    local_1f8.marked = '\0';
    local_1f8.gct = '\0';
    local_1f8.ctypeid = 0;
    local_1f8.nextgc.gcptr32 = cd[1].nextgc.gcptr32;
  }
  else {
    local_1f8 = cd[1];
  }
  local_200 = L->top;
  memset(local_1e8,0,0xb0);
  uVar3 = (ushort)pCVar20->info;
  pCVar18 = cts->tab + uVar3;
  uVar8 = cts->tab[uVar3].info;
  if ((uVar8 & 0xf8000000) == 0x38000000) {
    local_25c = 0;
    if ((pCVar18->size != 8) && (pCVar18->size != 0x10)) {
LAB_00136d1a:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    local_25c = 0;
    if ((uVar8 & 0xf4000000) == 0x34000000 || (uVar8 & 0xf0000000) == 0x10000000) {
      CVar6 = pCVar20->info;
      pvVar9 = lj_mem_newgco(cts->L,pCVar18->size + 8);
      *(undefined1 *)((long)pvVar9 + 5) = 10;
      *(short *)((long)pvVar9 + 6) = (short)CVar6;
      plVar2 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
      *plVar2 = *plVar2 + 1;
      pTVar11 = L->top;
      L->top = pTVar11 + 1;
      (pTVar11->u32).lo = (uint32_t)pvVar9;
      (pTVar11->field_2).it = 0xfffffff5;
      if ((pCVar18->info & 0xf0000000) == 0x10000000) {
        local_228[0].u64 = 0;
        iVar17 = ccall_classify_struct(cts,pCVar18,(int *)&local_228[0].u64,0);
        if (iVar17 != 0) {
          local_168[0].u64 = (long)pvVar9 + 8;
          local_1eb = '\x01';
          local_25c = 1;
          goto LAB_00136674;
        }
      }
      local_1eb = '\0';
      local_25c = 0;
    }
  }
LAB_00136674:
  local_208 = local_168;
  uVar8 = (uint)pCVar20->sib;
  uVar12 = 0;
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  pcVar16 = L->base + 1;
  if (pcVar16 < local_200) {
    uVar15 = 0;
    iVar17 = 1;
    uVar12 = 0;
    do {
      if (uVar8 == 0) {
        if ((pCVar20->info & 0x800000) == 0) goto LAB_00136d29;
        uVar8 = lj_ccall_ctid_vararg(cts,pcVar16);
        local_20c = 0;
      }
      else {
        local_20c = (uint)cts->tab[uVar8].sib;
        uVar8 = (uint)(ushort)cts->tab[uVar8].info;
      }
      uVar19 = cts->tab[uVar8].info;
      pCVar18 = cts->tab + uVar8;
      uVar8 = pCVar18->size;
      if (uVar19 < 0x10000000) {
        if (8 < uVar8) goto LAB_00136d1a;
        bVar21 = (uVar19 >> 0x1a & 1) == 0;
LAB_0013692e:
        bVar22 = false;
LAB_00136931:
        uVar19 = uVar8 + 7 >> 3;
        if (bVar21) {
          if ((0x17 < uVar8 + 7) || (6 < local_25c + uVar19)) {
LAB_001369ab:
            if (0x30000 < (pCVar18->info & 0xf0000)) {
              uVar8 = -1 << ((byte)(pCVar18->info + 0xd0000 >> 0x10) & 0xf);
              uVar15 = uVar15 + ~uVar8 & uVar8;
            }
            if (uVar15 + uVar19 < 0x21) {
              dp = local_138 + uVar15;
              uVar8 = (uint)uVar12;
              uVar15 = uVar15 + uVar19;
              goto LAB_00136a08;
            }
            goto LAB_00136d1a;
          }
          dp = local_168 + local_25c;
          local_25c = local_25c + uVar19;
        }
        else {
          uVar8 = uVar19;
          if ((pCVar18->info & 0xf8000000) == 0x38000000) {
            uVar8 = 1;
          }
          uVar8 = uVar8 + (uint)uVar12;
          dp = local_1e8 + uVar12 * 2;
          if (8 < uVar8) goto LAB_001369ab;
LAB_00136a08:
          uVar12 = (ulong)uVar8;
        }
        local_230 = dp;
        lj_cconv_ct_tv(cts,pCVar18,(uint8_t *)&dp->u64,pcVar16,iVar17 << 8);
        if (((pCVar18->info & 0xf4000000) == 0) && (uVar8 = pCVar18->size, uVar8 < 4)) {
          if ((pCVar18->info >> 0x17 & 1) == 0) {
            if (uVar8 == 1) {
              uVar8 = (uint)(char)*(byte *)local_230;
            }
            else {
              uVar8 = (uint)(short)*(ushort *)local_230;
            }
          }
          else if (uVar8 == 1) {
            uVar8 = (uint)*(byte *)local_230;
          }
          else {
            uVar8 = (uint)*(ushort *)local_230;
          }
          *(uint *)local_230 = uVar8;
        }
        if ((bool)(bVar22 & uVar19 == 2)) {
          uVar10 = (ulong)((int)uVar12 - 2);
          if (local_230 == local_1e8 + uVar10 * 2) {
            local_1e8[(ulong)((int)uVar12 - 1) * 2] = local_1e8[uVar10 * 2 + 1];
            local_1e8[uVar10 * 2 + 1].u64 = 0;
          }
        }
      }
      else {
        if ((uVar19 & 0xf8000000) == 0x38000000) {
          bVar21 = false;
          if (uVar8 == 8) goto LAB_0013692e;
          bVar22 = false;
          if (uVar8 == 0x10) goto LAB_00136931;
          goto LAB_00136d1a;
        }
        if ((uVar19 & 0xf0000000) != 0x10000000) {
          bVar22 = (uVar19 & 0xf4000000) == 0x34000000;
          bVar21 = !bVar22;
          if (!bVar22) {
            uVar8 = 8;
          }
          goto LAB_00136931;
        }
        local_238[0] = 0;
        local_238[1] = 0;
        iVar7 = ccall_classify_struct(cts,pCVar18,(int *)local_238,0);
        if (iVar7 == 0) {
          local_1ec = (byte)uVar15;
          local_1ea = (byte)local_25c;
          local_1e9 = (byte)uVar12;
          local_228[0].u64 = 0;
          local_228[1] = (cTValue)0x0;
          lj_cconv_ct_tv(cts,pCVar18,(uint8_t *)&local_228[0].u64,pcVar16,iVar17 << 8);
          uVar13 = (uint)local_1ea;
          uVar19 = (uint)local_1e9;
          lVar14 = 0;
          do {
            if ((local_238[lVar14] & 1) == 0) {
              if ((local_238[lVar14] & 2) != 0) {
                if (7 < uVar19) goto LAB_001368b3;
                uVar10 = (ulong)uVar19;
                uVar19 = uVar19 + 1;
                local_1e8[uVar10 * 2] = local_228[lVar14];
              }
            }
            else {
              if (5 < uVar13) {
LAB_001368b3:
                uVar10 = (ulong)local_1ec;
                iVar7 = 2 - (uint)(local_238[1] == 0);
                uVar19 = iVar7 + (uint)local_1ec;
                if (uVar19 < 0x21) {
                  local_1ec = (byte)uVar19;
                  memcpy(local_138 + uVar10,local_228,(ulong)(uint)(iVar7 * 8));
                  goto LAB_001368ef;
                }
                iVar7 = 2;
                goto LAB_0013691a;
              }
              uVar10 = (ulong)uVar13;
              uVar13 = uVar13 + 1;
              local_168[uVar10] = local_228[lVar14];
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 == 1);
          local_1ea = (byte)uVar13;
          local_1e9 = (byte)uVar19;
LAB_001368ef:
          uVar15 = (uint)local_1ec;
          local_25c = (uint)local_1ea;
          uVar12 = (ulong)local_1e9;
          iVar7 = 7;
        }
        else {
          iVar7 = 0;
        }
LAB_0013691a:
        if (iVar7 == 0) {
          bVar21 = true;
          goto LAB_0013692e;
        }
        if (iVar7 != 7) {
          if (iVar7 == 2) goto LAB_00136d1a;
          goto LAB_00136b24;
        }
      }
      iVar17 = iVar17 + 1;
      pcVar16 = pcVar16 + 1;
      uVar8 = local_20c;
    } while (pcVar16 < local_200);
  }
  else {
    uVar15 = 0;
  }
  if (uVar8 != 0) {
LAB_00136d29:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  local_1e9 = (byte)uVar12;
  local_1ec = (byte)uVar15;
  local_1f0 = 8;
  if (1 < uVar15) {
    local_1f0 = uVar15 * 8 | 8;
  }
LAB_00136b24:
  pCVar18 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  lj_vm_ffi_call(&local_1f8);
  if ((cts->cb).slot != 0xffffffff) {
    local_228[0].u64 = (ulong)local_1f8 >> 2;
    pTVar11 = lj_tab_set(L,cts->miscmap,local_228);
    (pTVar11->field_2).it = 0xfffffffd;
  }
  pCVar5 = cts->tab;
  uVar3 = *(ushort *)((long)pCVar20 + ((long)pCVar5 - (long)pCVar18));
  pCVar20 = pCVar5 + uVar3;
  uVar8 = pCVar5[uVar3].info;
  if ((uVar8 & 0xf0000000) == 0x40000000) {
    iVar7 = 0;
    iVar17 = 0;
    goto LAB_00136cd5;
  }
  if ((uVar8 & 0xf0000000) == 0x10000000) {
    if (local_1eb == '\0') {
      uVar8 = L->top[-1].u32.lo;
      local_238[0] = 0;
      local_238[1] = 0;
      lVar14 = 0;
      ccall_classify_struct(cts,pCVar20,(int *)local_238,0);
      uVar15 = pCVar20->size;
      uVar19 = 0;
      uVar13 = 0;
      do {
        if ((local_238[lVar14] & 1) == 0) {
          if ((local_238[lVar14] & 2) != 0) {
            uVar12 = (ulong)uVar19;
            uVar19 = uVar19 + 1;
            pcVar16 = local_1e8 + uVar12 * 2;
            goto LAB_00136c20;
          }
        }
        else {
          uVar12 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          pcVar16 = local_168 + uVar12;
LAB_00136c20:
          local_228[lVar14] = *pcVar16;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      memcpy((void *)((ulong)uVar8 + 8),local_228,(ulong)uVar15);
    }
LAB_00136c93:
    iVar7 = 1;
    iVar17 = 1;
  }
  else {
    if ((uVar8 & 0xf4000000) == 0x4000000) {
LAB_00136cac:
      local_208 = local_1e8;
    }
    else {
      if ((uVar8 & 0xf4000000) == 0x34000000) {
        CVar4 = pCVar20->size;
        uVar12 = (ulong)L->top[-1].u32.lo;
        *(cTValue *)(uVar12 + 8) = local_1e8[0];
        if (CVar4 != 8) {
          *(cTValue *)(uVar12 + 0x10) = local_1e8[2];
        }
        goto LAB_00136c93;
      }
      if ((uVar8 & 0xf8000000) == 0x38000000) goto LAB_00136cac;
    }
    iVar17 = lj_cconv_tv_ct(cts,pCVar20,0,L->top + -1,(uint8_t *)&local_208->u64);
    iVar7 = 1;
  }
LAB_00136cd5:
  if (0 < iVar17) {
    iVar17 = iVar17 + 1;
    do {
      uVar12 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar12 + 0x54) <= *(uint *)(uVar12 + 0x50)) {
        lj_gc_step(L);
      }
      iVar17 = iVar17 + -1;
    } while (1 < iVar17);
  }
  return iVar7;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}